

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

string * __thiscall
chaiscript::eval::Arg_List_AST_Node::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,Arg_List_AST_Node *this)

{
  long lVar1;
  ulong uVar2;
  ostringstream oss;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((this->super_AST_Node).children.
      super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_AST_Node).children.
      super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      (**(code **)**(undefined8 **)
                    ((long)&(((this->super_AST_Node).children.
                              super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar1))(&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)(this->super_AST_Node).children.
                                   super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_AST_Node).children.
                                   super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE 
        {
          std::ostringstream oss;
          for (size_t j = 0; j < this->children.size(); ++j) {
            if (j != 0)
            {
              oss << ", ";
            }

            oss << this->children[j]->pretty_print();
          }

          return oss.str();
        }